

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfunc.c
# Opt level: O0

void luaF_newtbcupval(lua_State *L,StkId level)

{
  StkId level_local;
  lua_State *L_local;
  
  if (((level->val).tt_ != '\x01') && (((level->val).tt_ & 0xf) != 0)) {
    checkclosemth(L,level);
    while (0xffff < (uint)((long)level - (L->tbclist).offset >> 4)) {
      (L->tbclist).p = (StkId)((L->tbclist).offset + 0xffff0);
      *(undefined2 *)((L->tbclist).offset + 10) = 0;
    }
    (level->tbclist).delta = (unsigned_short)((long)level - (L->tbclist).offset >> 4);
    (L->tbclist).p = level;
  }
  return;
}

Assistant:

void luaF_newtbcupval (lua_State *L, StkId level) {
  lua_assert(level > L->tbclist.p);
  if (l_isfalse(s2v(level)))
    return;  /* false doesn't need to be closed */
  checkclosemth(L, level);  /* value must have a close method */
  while (cast_uint(level - L->tbclist.p) > MAXDELTA) {
    L->tbclist.p += MAXDELTA;  /* create a dummy node at maximum delta */
    L->tbclist.p->tbclist.delta = 0;
  }
  level->tbclist.delta = cast(unsigned short, level - L->tbclist.p);
  L->tbclist.p = level;
}